

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tcprsstm.cpp
# Opt level: O2

void __thiscall CTPNStmExprBase::gen_code(CTPNStmExprBase *this,int param_1,int param_2)

{
  long lVar1;
  CTcTokenizer *pCVar2;
  
  pCVar2 = G_tok;
  lVar1 = (this->super_CTPNStm).super_CTPNStmBase.linenum_;
  G_tok->last_desc_ = (this->super_CTPNStm).super_CTPNStmBase.file_;
  pCVar2->last_linenum_ = lVar1;
  CTPNStmBase::add_debug_line_rec((CTPNStmBase *)this);
  (**(this->expr_->super_CTcPrsNodeBase)._vptr_CTcPrsNodeBase)(this->expr_,1);
  return;
}

Assistant:

void CTPNStmExprBase::gen_code(int, int)
{
    /* set our location for any errors that occur */
    G_tok->set_line_info(get_source_desc(), get_source_linenum());

    /* add a debug line record for the statement */
    add_debug_line_rec();

    /* 
     *   generate code in our expression - the result will not be used in any
     *   further calculation, so discard it; and since we don't care about
     *   the return value, use the looser "for condition" rules for any
     *   top-level logical operators in the expression so that we don't
     *   bother applying any extra conversions to a value we're just
     *   discarding anyway 
     */
    expr_->gen_code(TRUE, TRUE);
}